

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_add_body_amqp_data(MESSAGE_HANDLE message,BINARY_DATA amqp_data)

{
  size_t sVar1;
  MESSAGE_BODY_TYPE MVar2;
  LOGGER_LOG p_Var3;
  ulong uVar4;
  BODY_AMQP_DATA *pBVar5;
  uchar *__dest;
  int iVar6;
  size_t __size;
  int iVar7;
  uchar *__src;
  ulong uVar8;
  char *pcVar9;
  
  __size = amqp_data.length;
  __src = amqp_data.bytes;
  if ((message == (MESSAGE_HANDLE)0x0) || (__size != 0 && __src == (uchar *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x406;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
              ,"message_add_body_amqp_data",0x405,1,
              "Bad arguments: message = %p, bytes = %p, length = %u",message,__src,__size);
    return 0x406;
  }
  MVar2 = internal_get_body_type(message);
  if (MVar2 - MESSAGE_BODY_TYPE_SEQUENCE < 2) {
    p_Var3 = xlogging_get_log_function();
    iVar7 = 0x410;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x410;
    }
    pcVar9 = "Body type already set";
    iVar6 = 0x40f;
  }
  else {
    uVar4 = message->body_amqp_data_count + 1;
    uVar8 = 0xffffffffffffffff;
    if (uVar4 != 0) {
      uVar8 = uVar4;
    }
    if (uVar8 >> 0x3c == 0) {
      pBVar5 = (BODY_AMQP_DATA *)realloc(message->body_amqp_data_items,uVar8 << 4);
      if (pBVar5 != (BODY_AMQP_DATA *)0x0) {
        message->body_amqp_data_items = pBVar5;
        if (__size == 0) {
          sVar1 = message->body_amqp_data_count;
          pBVar5[sVar1].body_data_section_bytes = (uchar *)0x0;
          pBVar5[sVar1].body_data_section_length = 0;
          message->body_amqp_data_count = sVar1 + 1;
        }
        else {
          __dest = (uchar *)malloc(__size);
          sVar1 = message->body_amqp_data_count;
          pBVar5[sVar1].body_data_section_bytes = __dest;
          if (__dest == (uchar *)0x0) {
            p_Var3 = xlogging_get_log_function();
            iVar7 = 0x43a;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x43a;
            }
            pcVar9 = "Cannot allocate memory for body AMQP data to be added";
            iVar6 = 0x439;
            goto LAB_0011523b;
          }
          pBVar5[sVar1].body_data_section_length = __size;
          memcpy(__dest,__src,__size);
          message->body_amqp_data_count = sVar1 + 1;
        }
        return 0;
      }
      p_Var3 = xlogging_get_log_function();
      iVar7 = 0x424;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x424;
      }
      pcVar9 = "Cannot allocate memory for body AMQP data items";
      iVar6 = 0x423;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      iVar7 = 0x41a;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x41a;
      }
      pcVar9 = "Invalid size for new_body_amqp_data_items";
      iVar6 = 0x419;
    }
  }
LAB_0011523b:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_add_body_amqp_data",iVar6,1,pcVar9);
  return iVar7;
}

Assistant:

int message_add_body_amqp_data(MESSAGE_HANDLE message, BINARY_DATA amqp_data)
{
    int result;

    /* Codes_SRS_MESSAGE_01_088: [ If `message` is NULL, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
    if ((message == NULL) ||
        /* Tests_SRS_MESSAGE_01_089: [ If the `bytes` member of `amqp_data` is NULL and the `size` member is non-zero, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
        ((amqp_data.bytes == NULL) &&
            (amqp_data.length != 0)))
    {
        LogError("Bad arguments: message = %p, bytes = %p, length = %u",
            message, amqp_data.bytes, (unsigned int)amqp_data.length);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if ((body_type == MESSAGE_BODY_TYPE_SEQUENCE) ||
            (body_type == MESSAGE_BODY_TYPE_VALUE))
        {
            /* Codes_SRS_MESSAGE_01_091: [ If the body was already set to an AMQP value or a list of AMQP sequences, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
            LogError("Body type already set");
            result = MU_FAILURE;
        }
        else
        {
            size_t realloc_size = safe_add_size_t(message->body_amqp_data_count, 1);
            realloc_size = safe_multiply_size_t(sizeof(BODY_AMQP_DATA), realloc_size);

            if (realloc_size == SIZE_MAX)
            {
                LogError("Invalid size for new_body_amqp_data_items");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_086: [ `message_add_body_amqp_data` shall add the contents of `amqp_data` to the list of AMQP data values for the body of the message identified by `message`. ]*/
                BODY_AMQP_DATA* new_body_amqp_data_items = (BODY_AMQP_DATA*)realloc(message->body_amqp_data_items, realloc_size);
                if (new_body_amqp_data_items == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_153: [ If allocating memory to store the added AMQP data fails, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate memory for body AMQP data items");
                    result = MU_FAILURE;
                }
                else
                {
                    message->body_amqp_data_items = new_body_amqp_data_items;

                    if (amqp_data.length == 0)
                    {
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes = NULL;
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length = 0;
                        message->body_amqp_data_count++;

                        /* Codes_SRS_MESSAGE_01_087: [ On success it shall return 0. ]*/
                        result = 0;
                    }
                    else
                    {
                        message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes = (unsigned char*)malloc(amqp_data.length);
                        if (message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes == NULL)
                        {
                            /* Codes_SRS_MESSAGE_01_153: [ If allocating memory to store the added AMQP data fails, `message_add_body_amqp_data` shall fail and return a non-zero value. ]*/
                            LogError("Cannot allocate memory for body AMQP data to be added");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_length = amqp_data.length;
                            (void)memcpy(message->body_amqp_data_items[message->body_amqp_data_count].body_data_section_bytes, amqp_data.bytes, amqp_data.length);
                            message->body_amqp_data_count++;

                            /* Codes_SRS_MESSAGE_01_087: [ On success it shall return 0. ]*/
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}